

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElemSegmentElemExpr_RefNull
          (BinaryReaderInterp *this,Index segment_index,Type type)

{
  Result RVar1;
  Location loc;
  Location local_28;
  
  local_28.field_1.field_0.last_column = 0;
  local_28.filename._M_len = (this->filename_)._M_len;
  local_28.filename._M_str = (this->filename_)._M_str;
  local_28.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnElemSegmentElemExpr_RefNull(&this->validator_,&local_28,type);
  if (RVar1.enum_ != Error) {
    local_28.filename._M_len = 0;
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
    emplace_back<wabt::interp::ElemExpr>
              (&(this->module_->elems).
                super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].elements,(ElemExpr *)&local_28);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                         Type type) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefNull(GetLocation(), type));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefNull, 0});
  return Result::Ok;
}